

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O3

int Amap_LibNumPinsMax(Amap_Lib_t *p)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)p->vGates->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      bVar1 = *(byte *)((long)p->vGates->pArray[lVar4] + 0x3b);
      if (uVar2 <= bVar1) {
        uVar2 = (uint)bVar1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return uVar2;
  }
  return 0;
}

Assistant:

int Amap_LibNumPinsMax( Amap_Lib_t * p )
{
    Amap_Gat_t * pGate;
    int i, Counter = 0;
    Amap_LibForEachGate( p, pGate, i )
        if ( Counter < (int)pGate->nPins )
            Counter = pGate->nPins;
    return Counter;
}